

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

int bcf_sr_set_samples(bcf_srs_t *files,char *fname,int is_file)

{
  bcf_hdr_t *pbVar1;
  bcf_sr_t *pbVar2;
  uint3 uVar3;
  kh_str2int_t *pkVar4;
  uint uVar5;
  khint_t kVar6;
  int iVar7;
  char **__ptr;
  char **ppcVar8;
  char *pcVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  kh_str2int_t *hash_1;
  long lVar13;
  bool bVar14;
  int nsmpl;
  kh_str2int_t *hash;
  undefined4 local_44;
  ulong local_40;
  int ret;
  
  if ((byte)*fname == 0x5e) {
    hash = (kh_str2int_t *)khash_str2int_init();
    bVar14 = hash == (kh_str2int_t *)0x0;
  }
  else {
    uVar5 = (byte)*fname - 0x2d;
    if (uVar5 == 0) {
      uVar5 = (uint)(byte)fname[1];
    }
    if (uVar5 == 0) {
      pbVar1 = files->readers->header;
      __ptr = pbVar1->samples;
      nsmpl = pbVar1->n[2];
      uVar3 = (uint3)((uint)nsmpl >> 8);
      local_44 = (undefined4)CONCAT71((uint7)uVar3,1);
      hash = (kh_str2int_t *)0x0;
      local_40 = CONCAT44(local_40._4_4_,CONCAT31(uVar3,1));
      goto LAB_00112daf;
    }
    bVar14 = true;
    hash = (kh_str2int_t *)0x0;
  }
  __ptr = hts_readlist(fname,is_file,&nsmpl);
  pkVar4 = hash;
  if (__ptr == (char **)0x0) {
    fprintf(_stderr,"Could not read the file: \"%s\"\n",fname);
    return 0;
  }
  if (bVar14) {
    local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71((int7)((ulong)__ptr >> 8),1));
    local_44 = 0;
  }
  else {
    for (lVar11 = 0; lVar11 < nsmpl; lVar11 = lVar11 + 1) {
      kVar6 = kh_put_str2int(pkVar4,__ptr[lVar11],&ret);
      if (ret != 0) {
        pkVar4->vals[kVar6] = pkVar4->size - 1;
      }
    }
    local_44 = 0;
    local_40 = local_40 & 0xffffffff00000000;
  }
LAB_00112daf:
  files->samples = (char **)0x0;
  files->n_smpl = 0;
  lVar11 = 0;
  do {
    pkVar4 = hash;
    if (nsmpl <= lVar11) {
      if ((char)local_40 == '\0') {
        khash_str2int_destroy(hash);
      }
      if ((char)local_44 == '\0') {
        for (lVar11 = 0; lVar11 < nsmpl; lVar11 = lVar11 + 1) {
          free(__ptr[lVar11]);
        }
        free(__ptr);
      }
      iVar7 = files->n_smpl;
      if (iVar7 == 0) {
        iVar7 = 0;
        if (1 < files->nreaders) {
          fwrite("No samples in common.\n",0x16,1,_stderr);
          iVar7 = 0;
        }
      }
      else {
        lVar11 = 0;
        while (lVar11 < files->nreaders) {
          pbVar2 = files->readers;
          hash = (kh_str2int_t *)(long)iVar7;
          local_40 = lVar11;
          piVar10 = (int *)malloc((long)hash * 4);
          pbVar2[lVar11].samples = piVar10;
          pbVar2[lVar11].n_smpl = (int)hash;
          for (lVar12 = 0; lVar12 < iVar7; lVar12 = lVar12 + 1) {
            iVar7 = bcf_hdr_id2int(pbVar2[lVar11].header,2,files->samples[lVar12]);
            pbVar2[lVar11].samples[lVar12] = iVar7;
            iVar7 = files->n_smpl;
          }
          lVar11 = local_40 + 1;
        }
        iVar7 = 1;
      }
      return iVar7;
    }
    if (((char)local_40 != '\0') ||
       (kVar6 = kh_get_str2int(hash,__ptr[lVar11]), kVar6 == pkVar4->n_buckets)) {
      lVar12 = 0;
      for (lVar13 = 0; iVar7 = files->nreaders, lVar13 < iVar7; lVar13 = lVar13 + 1) {
        iVar7 = bcf_hdr_id2int(*(bcf_hdr_t **)((long)&files->readers->header + lVar12),2,
                               __ptr[lVar11]);
        if (iVar7 < 0) {
          iVar7 = files->nreaders;
          break;
        }
        lVar12 = lVar12 + 0x60;
      }
      if (iVar7 == (int)lVar13) {
        ppcVar8 = (char **)realloc(files->samples,(long)files->n_smpl * 8 + 8);
        files->samples = ppcVar8;
        pcVar9 = strdup(__ptr[lVar11]);
        iVar7 = files->n_smpl;
        files->n_smpl = iVar7 + 1;
        ppcVar8[iVar7] = pcVar9;
      }
      else {
        fprintf(_stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n",__ptr[lVar11]);
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

int bcf_sr_set_samples(bcf_srs_t *files, const char *fname, int is_file)
{
    int i, j, nsmpl, free_smpl = 0;
    char **smpl = NULL;

    void *exclude = (fname[0]=='^') ? khash_str2int_init() : NULL;
    if ( exclude || strcmp("-",fname) ) // "-" stands for all samples
    {
        smpl = hts_readlist(fname, is_file, &nsmpl);
        if ( !smpl )
        {
            fprintf(stderr,"Could not read the file: \"%s\"\n", fname);
            return 0;
        }
        if ( exclude )
        {
            for (i=0; i<nsmpl; i++)
                khash_str2int_inc(exclude, smpl[i]);
        }
        free_smpl = 1;
    }
    if ( !smpl )
    {
        smpl  = files->readers[0].header->samples;   // intersection of all samples
        nsmpl = bcf_hdr_nsamples(files->readers[0].header);
    }

    files->samples = NULL;
    files->n_smpl  = 0;
    for (i=0; i<nsmpl; i++)
    {
        if ( exclude && khash_str2int_has_key(exclude,smpl[i])  ) continue;

        int n_isec = 0;
        for (j=0; j<files->nreaders; j++)
        {
            if ( bcf_hdr_id2int(files->readers[j].header, BCF_DT_SAMPLE, smpl[i])<0 ) break;
            n_isec++;
        }
        if ( n_isec!=files->nreaders )
        {
            fprintf(stderr,"Warning: The sample \"%s\" was not found in %s, skipping\n", smpl[i], files->readers[n_isec].fname);
            continue;
        }

        files->samples = (char**) realloc(files->samples, (files->n_smpl+1)*sizeof(const char*));
        files->samples[files->n_smpl++] = strdup(smpl[i]);
    }

    if ( exclude ) khash_str2int_destroy(exclude);
    if ( free_smpl )
    {
        for (i=0; i<nsmpl; i++) free(smpl[i]);
        free(smpl);
    }

    if ( !files->n_smpl )
    {
        if ( files->nreaders>1 )
            fprintf(stderr,"No samples in common.\n");
        return 0;
    }
    for (i=0; i<files->nreaders; i++)
    {
        bcf_sr_t *reader = &files->readers[i];
        reader->samples  = (int*) malloc(sizeof(int)*files->n_smpl);
        reader->n_smpl   = files->n_smpl;
        for (j=0; j<files->n_smpl; j++)
            reader->samples[j] = bcf_hdr_id2int(reader->header, BCF_DT_SAMPLE, files->samples[j]);
    }
    return 1;
}